

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::WithFunctionSampleSyntax::setChild
          (WithFunctionSampleSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  FunctionPortListSyntax *local_148;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  WithFunctionSampleSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->with).kind = (undefined2)local_28;
    (this->with).field_0x2 = local_28._2_1_;
    (this->with).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->with).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->with).info = local_20;
    break;
  case 1:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->function).kind = (undefined2)local_38;
    (this->function).field_0x2 = local_38._2_1_;
    (this->function).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->function).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->function).info = local_30;
    break;
  case 2:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar2._0_8_;
    (this->sample).kind = (undefined2)local_48;
    (this->sample).field_0x2 = local_48._2_1_;
    (this->sample).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->sample).rawLen = local_48._4_4_;
    local_40 = TVar2.info;
    (this->sample).info = local_40;
    break;
  case 3:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_148 = (FunctionPortListSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_148 = SyntaxNode::as<slang::syntax::FunctionPortListSyntax>(pSVar1);
    }
    this->portList = local_148;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_e9);
    std::operator+(&local_c8,&local_e8,":");
    std::__cxx11::to_string(&local_120,0x377b);
    std::operator+(&local_a8,&local_c8,&local_120);
    std::operator+(&local_88,&local_a8,": ");
    std::operator+(&local_68,&local_88,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void WithFunctionSampleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: with = child.token(); return;
        case 1: function = child.token(); return;
        case 2: sample = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<FunctionPortListSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}